

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.c
# Opt level: O1

size_t ZSTD_compressSuperBlock
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,uint lastBlock
                 )

{
  seqDef *psVar1;
  ushort uVar2;
  ZSTD_longLengthType_e ZVar3;
  U32 UVar4;
  bool bVar5;
  symbolEncodingType_e sVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  U32 *workspace;
  void *pvVar10;
  int iVar11;
  size_t err_code_1;
  byte *pbVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  long lVar17;
  byte *pbVar18;
  ulong uVar19;
  long lVar20;
  size_t __n;
  uint uVar21;
  byte *pbVar22;
  U32 UVar23;
  U16 *pUVar24;
  byte *pbVar25;
  byte *pbVar26;
  U32 UVar27;
  U32 UVar28;
  byte *pbVar29;
  BYTE *source;
  uint uVar30;
  undefined4 in_register_0000008c;
  U8 *workspace_00;
  ulong uVar31;
  seqDef *psVar32;
  size_t err_code;
  size_t nbSeq;
  bool bVar33;
  byte bVar34;
  bool bVar35;
  undefined7 in_stack_fffffffffffffd78;
  undefined8 local_258;
  U32 local_250;
  byte *local_248;
  byte *local_240;
  byte *local_238;
  seqDef *local_230;
  seqDef *local_228;
  ZSTD_CCtx *local_220;
  ZSTD_compressedBlockState_t *local_218;
  byte *local_210;
  uint local_204;
  byte *local_200;
  byte *local_1f8;
  BYTE *local_1f0;
  BYTE *local_1e8;
  BYTE *local_1e0;
  BYTE *local_1d8;
  U32 *local_1d0;
  ZSTD_compressedBlockState_t *local_1c8;
  byte *local_1c0;
  undefined8 local_1b8;
  FSE_CTable *local_1b0;
  FSE_CTable *local_1a8;
  ZSTD_fseCTables_t *local_1a0;
  seqDef *local_198;
  void *local_190;
  ulong local_188;
  seqDef *local_180;
  size_t local_178;
  byte *local_170;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  
  local_1b8 = CONCAT44(in_register_0000008c,lastBlock);
  workspace_00 = (U8 *)zc->entropyWorkspace;
  local_248 = (byte *)ZSTD_buildBlockEntropyStats
                                (&zc->seqStore,&((zc->blockState).prevCBlock)->entropy,
                                 &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                                 &entropyMetadata,workspace_00,0x22d8);
  if (local_248 < (byte *)0xffffffffffffff89) {
    local_1c8 = (zc->blockState).prevCBlock;
    local_218 = (zc->blockState).nextCBlock;
    local_1d0 = zc->entropyWorkspace;
    psVar32 = (zc->seqStore).sequencesStart;
    local_198 = (zc->seqStore).sequences;
    source = (zc->seqStore).litStart;
    local_1d8 = (zc->seqStore).lit;
    local_1f8 = (byte *)src;
    local_1c0 = (byte *)(srcSize + (long)src);
    local_200 = (byte *)(dstCapacity + (long)dst);
    local_1e0 = (zc->seqStore).llCode;
    local_1e8 = (zc->seqStore).mlCode;
    local_1f0 = (zc->seqStore).ofCode;
    local_170 = (byte *)(zc->appliedParams).targetCBlockSize;
    bVar33 = entropyMetadata.hufMetadata.hType == set_compressed;
    local_188 = (ulong)(uint)zc->bmi2;
    local_204 = (uint)(zc->bmi2 != 0);
    local_180 = local_198 + -1;
    local_1a0 = &(local_218->entropy).fse;
    local_1a8 = (local_218->entropy).fse.litlengthCTable;
    local_1b0 = (local_218->entropy).fse.matchlengthCTable;
    bVar8 = true;
    nbSeq = 0;
    pbVar12 = (byte *)0x0;
    local_190 = dst;
    local_228 = psVar32;
    local_220 = zc;
    local_230 = psVar32;
    local_248 = (byte *)dst;
    do {
      if (psVar32 == local_198) {
        bVar34 = true;
        pbVar29 = pbVar12;
      }
      else {
        psVar1 = local_228 + nbSeq;
        bVar34 = psVar1 == local_180;
        uVar2 = psVar1->litLength;
        uVar30 = (uint)uVar2;
        if ((zc->seqStore).longLengthPos ==
            (U32)((ulong)((long)psVar1 - (long)(zc->seqStore).sequencesStart) >> 3)) {
          uVar30 = uVar2 + 0x10000;
          if ((zc->seqStore).longLengthType != ZSTD_llt_literalLength) {
            uVar30 = (uint)uVar2;
          }
        }
        nbSeq = nbSeq + 1;
        pbVar29 = pbVar12 + uVar30;
      }
      pbVar12 = pbVar29;
      if ((bool)bVar34 != false) {
        if (local_1d8 < source) {
          __assert_fail("lp <= lend",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                        ,0x1db,
                        "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                       );
        }
        pbVar12 = local_1d8 + -(long)source;
        if (pbVar12 < pbVar29) {
          __assert_fail("litSize <= (size_t)(lend - lp)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                        ,0x1dc,
                        "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                       );
        }
      }
      local_258 = CONCAT44(local_258._4_4_,0xff);
      pbVar29 = pbVar12;
      if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
        workspace_00 = (U8 *)0x22d8;
        sVar13 = HIST_count_wksp(local_1d0,(uint *)&local_258,source,(size_t)pbVar12,local_1d0,
                                 0x22d8);
        if (sVar13 < 0xffffffffffffff89) {
          sVar14 = HUF_estimateCompressedSize((HUF_CElt *)local_218,local_1d0,(uint)local_258);
          sVar13 = entropyMetadata.hufMetadata.hufDesSize;
          if (!bVar33) {
            sVar13 = 0;
          }
          pbVar29 = (byte *)(sVar13 + sVar14 + 3);
        }
      }
      else if (entropyMetadata.hufMetadata.hType != set_basic) {
        if (entropyMetadata.hufMetadata.hType != set_rle) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                        ,0x145,
                        "size_t ZSTD_estimateSubBlockSize_literal(const BYTE *, size_t, const ZSTD_hufCTables_t *, const ZSTD_hufCTablesMetadata_t *, void *, size_t, int)"
                       );
        }
        pbVar29 = &DAT_00000001;
      }
      workspace = local_1d0;
      if (nbSeq == 0) {
        lVar17 = 3;
      }
      else {
        sVar14 = ZSTD_estimateSubBlockSize_symbolType
                           (entropyMetadata.fseMetadata.ofType,local_1f0,0x1f,nbSeq,
                            local_1a0->offcodeCTable,(U8 *)0x0,OF_defaultNorm,5,0x1c,local_1d0,
                            CONCAT17(bVar34,in_stack_fffffffffffffd78));
        sVar15 = ZSTD_estimateSubBlockSize_symbolType
                           (entropyMetadata.fseMetadata.llType,local_1e0,0x23,nbSeq,local_1a8,"",
                            LL_defaultNorm,6,0x23,workspace,
                            CONCAT17(bVar34,in_stack_fffffffffffffd78));
        workspace_00 = "";
        sVar16 = ZSTD_estimateSubBlockSize_symbolType
                           (entropyMetadata.fseMetadata.mlType,local_1e8,0x34,nbSeq,local_1b0,"",
                            ML_defaultNorm,6,0x34,workspace,
                            CONCAT17(bVar34,in_stack_fffffffffffffd78));
        sVar13 = 0;
        if (bVar8) {
          sVar13 = entropyMetadata.fseMetadata.fseTablesSize;
        }
        lVar17 = sVar13 + sVar14 + sVar15 + sVar16 + 3;
        zc = local_220;
        psVar32 = local_230;
      }
      pbVar18 = local_200;
      bVar35 = true;
      pbVar26 = local_210;
      if ((~bVar34 & pbVar29 + lVar17 + 3 <= local_170) == 0) {
        if ((long)nbSeq < 1) {
          pbVar29 = (byte *)0x0;
          lVar17 = 0;
        }
        else {
          uVar19 = (long)local_228 - (long)(zc->seqStore).sequencesStart;
          lVar20 = nbSeq * 8;
          pUVar24 = &local_228->mlBase;
          lVar17 = 0;
          pbVar29 = (byte *)0x0;
          do {
            uVar2 = pUVar24[-1];
            uVar30 = *pUVar24 + 3;
            uVar21 = (uint)uVar2;
            if ((zc->seqStore).longLengthPos == (U32)(uVar19 >> 3)) {
              ZVar3 = (zc->seqStore).longLengthType;
              uVar21 = uVar2 + 0x10000;
              if (ZVar3 != ZSTD_llt_literalLength) {
                uVar21 = (uint)uVar2;
              }
              if (ZVar3 == ZSTD_llt_matchLength) {
                uVar30 = *pUVar24 + 0x10003;
              }
            }
            workspace_00 = (U8 *)(ulong)uVar30;
            lVar17 = lVar17 + (long)workspace_00;
            pbVar29 = pbVar29 + uVar21;
            uVar19 = uVar19 + 8;
            lVar20 = lVar20 + -8;
            pUVar24 = pUVar24 + 4;
          } while (0 < lVar20);
        }
        local_178 = nbSeq;
        if (pbVar12 < pbVar29) {
          __assert_fail("litLengthSum <= litSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                        ,0x91,
                        "size_t ZSTD_seqDecompressedSize(const seqStore_t *, const seqDef *, size_t, size_t, int)"
                       );
        }
        if (pbVar29 != pbVar12 && bVar34 == 0) {
          __assert_fail("litLengthSum == litSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                        ,0x93,
                        "size_t ZSTD_seqDecompressedSize(const seqStore_t *, const seqDef *, size_t, size_t, int)"
                       );
        }
        bVar35 = (int)local_1b8 != 0;
        pbVar29 = local_200 + (-3 - (long)local_248);
        lVar20 = 0;
        if (bVar33) {
          lVar20 = 200;
        }
        pbVar26 = local_248 + 3;
        sVar6 = entropyMetadata.hufMetadata.hType;
        if (!bVar33) {
          sVar6 = set_repeat;
        }
        lVar20 = (ulong)((byte *)(0x4000 - lVar20) <= pbVar12) -
                 (ulong)(pbVar12 < (byte *)(0x400 - lVar20));
        if (pbVar12 == (byte *)0x0) {
LAB_0077dd45:
          pbVar18 = (byte *)ZSTD_noCompressLiterals(pbVar26,(size_t)pbVar29,source,(size_t)pbVar12);
LAB_0077dedd:
          workspace_00 = (U8 *)CONCAT71((int7)((ulong)workspace_00 >> 8),1);
        }
        else {
          if (1 < entropyMetadata.hufMetadata.hType - set_compressed) {
            if (entropyMetadata.hufMetadata.hType != set_rle) {
              if (entropyMetadata.hufMetadata.hType != set_basic) {
                __assert_fail("hufMetadata->hType == set_compressed || hufMetadata->hType == set_repeat"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                              ,0x45,
                              "size_t ZSTD_compressSubBlock_literal(const HUF_CElt *, const ZSTD_hufCTablesMetadata_t *, const BYTE *, size_t, void *, size_t, const int, int, int *)"
                             );
              }
              goto LAB_0077dd45;
            }
            pbVar18 = (byte *)ZSTD_compressRleLiteralsBlock
                                        (pbVar26,(size_t)pbVar29,source,(size_t)pbVar12);
            goto LAB_0077dedd;
          }
          local_240 = local_248 + lVar20 + 7;
          if (entropyMetadata.hufMetadata.hType == set_compressed && bVar33) {
            memcpy(local_240,entropyMetadata.hufMetadata.hufDesBuffer,
                   entropyMetadata.hufMetadata.hufDesSize);
            local_238 = (byte *)entropyMetadata.hufMetadata.hufDesSize;
            local_240 = local_240 + entropyMetadata.hufMetadata.hufDesSize;
          }
          else {
            local_238 = (byte *)0x0;
          }
          uVar19 = lVar20 + 4;
          if (uVar19 == 3) {
            uVar31 = (ulong)local_204;
            pbVar22 = (byte *)HUF_compress1X_usingCTable
                                        (local_240,(long)pbVar18 - (long)local_240,source,
                                         (size_t)pbVar12,(HUF_CElt *)local_218,local_204);
          }
          else {
            uVar31 = (ulong)local_204;
            pbVar22 = (byte *)HUF_compress4X_usingCTable
                                        (local_240,(long)pbVar18 - (long)local_240,source,
                                         (size_t)pbVar12,(HUF_CElt *)local_218,local_204);
          }
          pbVar25 = local_238 + (long)pbVar22;
          if (pbVar22 + -1 < (byte *)0xffffffffffffff88) {
            if ((bVar33) || (pbVar25 < pbVar12)) {
              bVar5 = true;
              if (((ulong)((byte *)0x3ff < pbVar25) - (ulong)(pbVar25 < (byte *)0x4000)) + 4 <=
                  uVar19) goto LAB_0077de8c;
              if (pbVar25 <= pbVar12) {
                __assert_fail("cLitSize > litSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                              ,0x5e,
                              "size_t ZSTD_compressSubBlock_literal(const HUF_CElt *, const ZSTD_hufCTablesMetadata_t *, const BYTE *, size_t, void *, size_t, const int, int, int *)"
                             );
              }
            }
            local_238 = pbVar22;
            pbVar18 = (byte *)ZSTD_noCompressLiterals
                                        (pbVar26,(size_t)pbVar29,source,(size_t)pbVar12);
            bVar5 = false;
            pbVar22 = local_238;
          }
          else {
            bVar5 = false;
            pbVar18 = (byte *)0x0;
          }
LAB_0077de8c:
          workspace_00 = (U8 *)CONCAT71((int7)(uVar31 >> 8),1);
          if (bVar5) {
            uVar30 = (uint)pbVar25;
            iVar11 = (int)pbVar12;
            if (uVar19 == 5) {
              *(symbolEncodingType_e *)(local_248 + 3) =
                   uVar30 * 0x400000 + sVar6 + iVar11 * 0x10 + 0xc;
              local_248[7] = (byte)(uVar30 >> 10);
            }
            else if (uVar19 == 4) {
              *(symbolEncodingType_e *)pbVar26 = uVar30 * 0x40000 + sVar6 + iVar11 * 0x10 + 8;
            }
            else {
              iVar11 = iVar11 * 0x10 + (uint)(uVar19 != 3) * 4 + sVar6 + uVar30 * 0x4000;
              *(short *)(local_248 + 3) = (short)iVar11;
              local_248[5] = (byte)((uint)iVar11 >> 0x10);
            }
            pbVar18 = local_240 + (long)pbVar22 + -(long)pbVar26;
            workspace_00 = (U8 *)0x0;
          }
        }
        bVar5 = false;
        if (pbVar18 < (byte *)0xffffffffffffff89) {
          if (pbVar18 == (byte *)0x0) {
            bVar7 = false;
            pbVar18 = (byte *)0x0;
          }
          else {
            pbVar26 = pbVar26 + (long)pbVar18;
            bVar7 = true;
          }
        }
        else {
          bVar7 = false;
        }
        if (bVar7) {
          uVar30 = (local_220->appliedParams).cParams.windowLog;
          pbVar29 = (byte *)0xffffffffffffffba;
          bVar5 = false;
          if (3 < (long)local_200 - (long)pbVar26) {
            if (nbSeq < 0x7f) {
              pbVar29 = pbVar26 + 1;
              *pbVar26 = (byte)nbSeq;
            }
            else if (nbSeq < 0x7f00) {
              *pbVar26 = (byte)(nbSeq >> 8) | 0x80;
              pbVar26[1] = (byte)nbSeq;
              pbVar29 = pbVar26 + 2;
            }
            else {
              *pbVar26 = 0xff;
              *(short *)(pbVar26 + 1) = (short)nbSeq + -0x7f00;
              pbVar29 = pbVar26 + 3;
            }
            if (nbSeq == 0) {
              pbVar29 = pbVar29 + -(long)pbVar26;
            }
            else {
              local_240 = (byte *)CONCAT44(local_240._4_4_,(int)workspace_00);
              pbVar22 = pbVar29 + 1;
              local_238 = pbVar29;
              if (bVar8) {
                *pbVar29 = (char)(entropyMetadata.fseMetadata.ofType << 4) +
                           (char)(entropyMetadata.fseMetadata.llType << 6) +
                           (char)entropyMetadata.fseMetadata.mlType * '\x04';
                memcpy(pbVar22,entropyMetadata.fseMetadata.fseTablesBuffer,
                       entropyMetadata.fseMetadata.fseTablesSize);
                pbVar22 = pbVar22 + entropyMetadata.fseMetadata.fseTablesSize;
              }
              else {
                *pbVar29 = 0xfc;
              }
              pbVar29 = (byte *)ZSTD_encodeSequences
                                          (pbVar22,(long)local_200 - (long)pbVar22,local_1b0,
                                           local_1e8,local_1a0->offcodeCTable,local_1f0,local_1a8,
                                           local_1e0,local_228,nbSeq,(uint)(0x39 < uVar30),
                                           (int)local_188);
              bVar5 = false;
              if (pbVar29 < (byte *)0xffffffffffffff89) {
                pbVar22 = pbVar22 + (long)pbVar29;
                bVar7 = true;
                if (((bVar8) && (entropyMetadata.fseMetadata.lastCountSize != 0)) &&
                   (pbVar29 + entropyMetadata.fseMetadata.lastCountSize < (byte *)0x4)) {
                  if (pbVar29 + entropyMetadata.fseMetadata.lastCountSize != (byte *)0x3) {
                    __assert_fail("fseMetadata->lastCountSize + bitstreamSize == 3",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                                  ,0xe7,
                                  "size_t ZSTD_compressSubBlock_sequences(const ZSTD_fseCTables_t *, const ZSTD_fseCTablesMetadata_t *, const seqDef *, size_t, const BYTE *, const BYTE *, const BYTE *, const ZSTD_CCtx_params *, void *, size_t, const int, int, int *)"
                                 );
                  }
                  bVar7 = false;
                  pbVar29 = (byte *)0x0;
                }
              }
              else {
                bVar7 = false;
              }
              workspace_00 = (U8 *)((ulong)local_240 & 0xffffffff);
              if (bVar7) {
                pbVar29 = pbVar22 + -(long)pbVar26;
                bVar5 = 3 < (long)pbVar22 - (long)local_238;
                if ((long)pbVar22 - (long)local_238 < 4) {
                  pbVar29 = (byte *)0x0;
                }
              }
            }
          }
          if (pbVar29 < (byte *)0xffffffffffffff89) {
            if (pbVar29 == (byte *)0x0) {
              bVar7 = false;
              pbVar18 = (byte *)0x0;
            }
            else {
              pbVar26 = pbVar26 + (long)pbVar29;
              bVar7 = true;
            }
          }
          else {
            bVar7 = false;
            pbVar18 = pbVar29;
          }
          if (bVar7) {
            pbVar18 = pbVar26 + -(long)local_248;
            iVar11 = (bVar35 & bVar34 | 0xffffffec) + (int)pbVar18 * 8;
            *(short *)local_248 = (short)iVar11;
            local_248[2] = (byte)((uint)iVar11 >> 0x10);
          }
        }
        bVar35 = pbVar18 < (byte *)0xffffffffffffff89;
        zc = local_220;
        psVar32 = local_230;
        pbVar26 = pbVar18;
        if (bVar35) {
          if ((pbVar18 != (byte *)0x0) && (pbVar29 = pbVar12 + lVar17, pbVar18 < pbVar29)) {
            local_1f8 = local_1f8 + (long)pbVar29;
            if (local_1c0 < local_1f8) {
              __assert_fail("ip + decompressedSize <= iend",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                            ,0x1f7,
                            "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                           );
            }
            local_228 = local_228 + nbSeq;
            source = source + (long)pbVar12;
            local_248 = local_248 + (long)pbVar18;
            local_1e0 = local_1e0 + nbSeq;
            local_1e8 = local_1e8 + nbSeq;
            local_1f0 = local_1f0 + nbSeq;
            if ((char)workspace_00 == '\0') {
              bVar33 = false;
            }
            if (bVar5) {
              bVar8 = false;
            }
            nbSeq = 0;
            pbVar12 = (byte *)0x0;
          }
          bVar35 = true;
          pbVar26 = local_210;
        }
      }
      local_210 = pbVar26;
      if (!bVar35) {
        return (size_t)local_210;
      }
    } while (bVar34 == 0);
    if (bVar33) {
      memcpy(local_218,local_1c8,0x810);
    }
    pvVar10 = local_190;
    psVar1 = local_228;
    if ((bVar8) &&
       (((entropyMetadata.fseMetadata.llType - set_rle < 2 ||
         (entropyMetadata.fseMetadata.mlType - set_rle < 2)) ||
        (0xfffffffd < entropyMetadata.fseMetadata.ofType - set_repeat)))) {
      local_248 = (byte *)0x0;
    }
    else {
      if (local_1f8 < local_1c0) {
        __n = (long)local_1c0 - (long)local_1f8;
        pbVar12 = (byte *)0xffffffffffffffba;
        if ((byte *)(__n + 3) <= local_200 + -(long)local_248) {
          iVar11 = (int)local_1b8 + (int)__n * 8;
          *(short *)local_248 = (short)iVar11;
          local_248[2] = (byte)((uint)iVar11 >> 0x10);
          memcpy(local_248 + 3,local_1f8,__n);
          pbVar12 = (byte *)(__n + 3);
        }
        if ((byte *)0xffffffffffffff88 < pbVar12) {
          local_210 = pbVar12;
        }
        if ((byte *)0xffffffffffffff88 >= pbVar12) {
          if (pbVar12 == (byte *)0x0) {
            __assert_fail("cSize != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                          ,0x21a,
                          "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                         );
          }
          local_248 = local_248 + (long)pbVar12;
          if (psVar1 < local_198) {
            UVar28 = local_1c8->rep[2];
            local_250 = UVar28;
            local_258 = *(undefined8 *)local_1c8->rep;
            uVar9 = local_258;
            if (psVar32 < psVar1) {
              local_258._4_4_ = (U32)((ulong)local_258 >> 0x20);
              uVar19 = (long)psVar32 - (long)(zc->seqStore).sequencesStart;
              UVar23 = (uint)local_258;
              UVar27 = local_258._4_4_;
              local_258 = uVar9;
              do {
                uVar2 = psVar32->litLength;
                uVar30 = (uint)uVar2;
                if (((zc->seqStore).longLengthPos == (U32)(uVar19 >> 3)) &&
                   (uVar30 = uVar2 + 0x10000,
                   (zc->seqStore).longLengthType != ZSTD_llt_literalLength)) {
                  uVar30 = (uint)uVar2;
                }
                uVar21 = psVar32->offBase;
                if (uVar21 < 4) {
                  if (uVar21 == 0) {
                    __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                                  ,0x2d5,"void ZSTD_updateRep(U32 *, const U32, const U32)");
                  }
                  uVar30 = (uVar21 + (uVar30 == 0)) - 1;
                  UVar4 = UVar23;
                  if (uVar30 != 0) {
                    if (uVar30 == 3) {
                      UVar4 = UVar23 - 1;
                    }
                    else {
                      UVar4 = *(U32 *)((long)&local_258 + (ulong)uVar30 * 4);
                    }
                    if (uVar30 == 1) {
                      UVar27 = UVar28;
                    }
                    UVar28 = UVar27;
                    local_250 = UVar28;
                    local_258 = CONCAT44(UVar23,UVar4);
                    UVar27 = UVar23;
                  }
                }
                else {
                  local_250 = UVar27;
                  local_258 = CONCAT44(UVar23,uVar21 - 3);
                  UVar4 = uVar21 - 3;
                  UVar28 = UVar27;
                  UVar27 = UVar23;
                }
                UVar23 = UVar4;
                psVar32 = psVar32 + 1;
                uVar19 = uVar19 + 8;
              } while (psVar32 < psVar1);
            }
            local_218->rep[2] = local_250;
            *(undefined8 *)local_218->rep = local_258;
          }
        }
        if ((byte *)0xffffffffffffff88 < pbVar12) {
          return (size_t)local_210;
        }
      }
      local_248 = local_248 + -(long)pvVar10;
    }
  }
  return (size_t)local_248;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               void const* src, size_t srcSize,
                               unsigned lastBlock) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */), "");

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            zc->blockState.prevCBlock,
            zc->blockState.nextCBlock,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            src, srcSize,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}